

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

span<const_slang::ast::Expression_*const,_18446744073709551615UL> __thiscall
slang::ast::createUninstantiatedParams
          (ast *this,HierarchyInstantiationSyntax *syntax,ASTContext *context)

{
  long lVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar2;
  int iVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ASTContext *extraout_RDX;
  ASTContext *extraout_RDX_00;
  ASTContext *extraout_RDX_01;
  __extent_storage<18446744073709551615UL> extraout_RDX_02;
  ulong uVar5;
  long lVar6;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar7;
  SmallVector<const_slang::ast::Expression_*,_5UL> params;
  Expression *local_78;
  SmallVectorBase<const_slang::ast::Expression_*> local_70 [2];
  
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  lVar1 = *(long *)(this + 0x60);
  if ((lVar1 != 0) && (uVar5 = *(long *)(lVar1 + 0x68) + 1, 1 < uVar5)) {
    uVar5 = uVar5 >> 1;
    lVar6 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           (*(long *)(lVar1 + 0x60) + lVar6));
      pSVar2 = *ppSVar4;
      context = extraout_RDX;
      if (pSVar2->kind == NamedParamAssignment) {
        if (*(long *)(pSVar2 + 3) != 0) {
          iVar3 = Expression::bind((int)*(long *)(pSVar2 + 3),(sockaddr *)syntax,4);
          local_78 = (Expression *)CONCAT44(extraout_var_00,iVar3);
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,&local_78);
          context = extraout_RDX_01;
        }
      }
      else if (pSVar2->kind == OrderedParamAssignment) {
        iVar3 = Expression::bind((int)*(undefined8 *)(pSVar2 + 1),(sockaddr *)syntax,0);
        local_78 = (Expression *)CONCAT44(extraout_var,iVar3);
        SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,&local_78);
        context = extraout_RDX_00;
      }
      lVar6 = lVar6 + 0x30;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  sVar7._M_ptr._0_4_ =
       SmallVectorBase<const_slang::ast::Expression_*>::copy
                 (local_70,(EVP_PKEY_CTX *)
                           **(undefined8 **)&(syntax->super_MemberSyntax).super_SyntaxNode,
                  (EVP_PKEY_CTX *)context);
  sVar7._M_ptr._4_4_ = extraout_var_01;
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  sVar7._M_extent._M_extent_value = extraout_RDX_02._M_extent_value;
  return sVar7;
}

Assistant:

static std::span<const Expression* const> createUninstantiatedParams(
    const HierarchyInstantiationSyntax& syntax, const ASTContext& context) {

    SmallVector<const Expression*> params;
    if (syntax.parameters) {
        for (auto expr : syntax.parameters->parameters) {
            // Empty expressions are just ignored here.
            if (expr->kind == SyntaxKind::OrderedParamAssignment) {
                params.push_back(
                    &Expression::bind(*expr->as<OrderedParamAssignmentSyntax>().expr, context));
            }
            else if (expr->kind == SyntaxKind::NamedParamAssignment) {
                if (auto ex = expr->as<NamedParamAssignmentSyntax>().expr)
                    params.push_back(&Expression::bind(*ex, context, ASTFlags::AllowDataType));
            }
        }
    }

    return params.copy(context.getCompilation());
}